

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

ply_type gvr::anon_unknown_3::PLYProperty::name2Type(string *name)

{
  bool bVar1;
  ply_type pVar2;
  
  bVar1 = std::operator==(name,"int8");
  pVar2 = ply_int8;
  if (!bVar1) {
    bVar1 = std::operator==(name,"char");
    if (!bVar1) {
      bVar1 = std::operator==(name,"uint8");
      pVar2 = ply_uint8;
      if (!bVar1) {
        bVar1 = std::operator==(name,"uchar");
        if (!bVar1) {
          bVar1 = std::operator==(name,"int16");
          pVar2 = ply_int16;
          if (!bVar1) {
            bVar1 = std::operator==(name,"short");
            if (!bVar1) {
              bVar1 = std::operator==(name,"uint16");
              pVar2 = ply_uint16;
              if (!bVar1) {
                bVar1 = std::operator==(name,"ushort");
                if (!bVar1) {
                  bVar1 = std::operator==(name,"int32");
                  pVar2 = ply_int32;
                  if (!bVar1) {
                    bVar1 = std::operator==(name,"int");
                    if (!bVar1) {
                      bVar1 = std::operator==(name,"uint32");
                      pVar2 = ply_uint32;
                      if (!bVar1) {
                        bVar1 = std::operator==(name,"uint");
                        if (!bVar1) {
                          bVar1 = std::operator==(name,"float32");
                          pVar2 = ply_float32;
                          if (!bVar1) {
                            bVar1 = std::operator==(name,"float");
                            if (!bVar1) {
                              bVar1 = std::operator==(name,"float64");
                              if (bVar1) {
                                pVar2 = ply_float64;
                              }
                              else {
                                bVar1 = std::operator==(name,"double");
                                pVar2 = (uint)bVar1 << 3;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pVar2;
}

Assistant:

ply_type PLYProperty::name2Type(const std::string &name)
{
  if (name == "int8" || name == "char")
  {
    return ply_int8;
  }
  else if (name == "uint8" || name == "uchar")
  {
    return ply_uint8;
  }
  else if (name == "int16" || name == "short")
  {
    return ply_int16;
  }
  else if (name == "uint16" || name == "ushort")
  {
    return ply_uint16;
  }
  else if (name == "int32" || name == "int")
  {
    return ply_int32;
  }
  else if (name == "uint32" || name == "uint")
  {
    return ply_uint32;
  }
  else if (name == "float32" || name == "float")
  {
    return ply_float32;
  }
  else if (name == "float64" || name == "double")
  {
    return ply_float64;
  }

  assert(false);

  return ply_none;
}